

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Read.cpp
# Opt level: O2

expected<const_idx2::chunk_cache_*,_idx2::idx2_err_code> *
idx2::ReadChunk(expected<const_idx2::chunk_cache_*,_idx2::idx2_err_code> *__return_storage_ptr__,
               idx2_file *Idx2,decode_data *D,u64 Brick,i8 Level,i8 Subband,i16 BpKey)

{
  byte *pbVar1;
  FILE *pFVar2;
  decode_data *pdVar3;
  i64 ChunkCache_00;
  int iVar4;
  __off_t _Var5;
  __off_t _Var6;
  ulong uVar7;
  byte bVar8;
  bool bVar9;
  unsigned_long *Key;
  long lVar10;
  undefined4 uVar11;
  char cVar12;
  uint uVar13;
  undefined7 in_register_00000081;
  chunk_cache *Val;
  undefined7 in_register_00000089;
  ulong *puVar14;
  ulong *puVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  char *pcVar19;
  int I;
  size_t sVar20;
  ulong uVar21;
  long *in_FS_OFFSET;
  stref sVar22;
  FILE *Fp;
  expected<const_idx2::chunk_cache_*,_idx2::idx2_err_code> *local_320;
  int NChunks;
  FILE *local_310;
  decode_data *local_308;
  undefined4 local_2fc;
  timer IOTimer_1;
  ulong *local_2e0;
  ulong local_2d8;
  uint local_2d0;
  timer IOTimer;
  file_id FileId;
  iterator FileCacheIt;
  u64 ChunkAddress;
  chunk_cache *pcStack_270;
  mallocator *local_268;
  u64 local_258;
  u64 ChunkAddr;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:123:3)>
  __ScopeGuard__123;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:116:3)>
  __ScopeGuard__116;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:112:3)>
  __ScopeGuard__112;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:98:3)>
  __ScopeGuard__98;
  int ChunkSizesSz;
  int ChunkAddrsSz;
  int S;
  buffer local_1f8;
  FILE *Fp_1;
  i64 iStack_1d0;
  mallocator *local_1c8;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:205:5)>
  __ScopeGuard__205;
  file_cache FileCache;
  chunk_cache ChunkCache;
  
  local_310 = (FILE *)CONCAT44(local_310._4_4_,(int)CONCAT71(in_register_00000081,Level));
  Key = (unsigned_long *)(CONCAT71(in_register_00000081,Level) & 0xffffffff);
  local_2fc = (undefined4)CONCAT71(in_register_00000089,Subband);
  local_320 = __return_storage_ptr__;
  local_258 = Brick;
  ConstructFilePath(&FileId,Idx2,Brick,(i8)Key,Subband,BpKey);
  local_308 = D;
  Lookup<unsigned_long,idx2::file_cache>
            (&FileCacheIt,(idx2 *)&D->FileCacheTable,
             (hash_table<unsigned_long,_idx2::file_cache> *)&FileId.Id,Key);
  clock_gettime(1,(timespec *)&IOTimer);
  if (((FileCacheIt.Ht)->Stats[FileCacheIt.Idx] == Occupied) &&
     ((FileCacheIt.Val)->DataCached == true)) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x60;
    pcVar19 = "";
    uVar11 = 0;
  }
  else {
    Fp = (FILE *)fopen(FileId.Name.field_0.Ptr,"rb");
    __ScopeGuard__98.Func.Fp = &Fp;
    __ScopeGuard__98.Dismissed = false;
    if ((FILE *)Fp == (FILE *)0x0) {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 99;
      sVar22 = ToString(FileNotFound);
      lVar10 = *in_FS_OFFSET;
      iVar4 = snprintf((char *)(lVar10 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                       (ulong)(uint)sVar22.Size,sVar22.field_0.Ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                       ,99);
      pcVar19 = "File: %s";
      snprintf((char *)(lVar10 + -0xf80) + iVar4,0x400 - (long)iVar4,"File: %s",
               FileId.Name.field_0.Ptr);
      uVar11 = 0x10025;
    }
    else {
      fseeko((FILE *)Fp,0,2);
      _Var5 = ftello((FILE *)Fp);
      pFVar2 = Fp;
      S = 0;
      _Var6 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar2,_Var6 + -4,0);
      fread(&S,4,1,(FILE *)pFVar2);
      fseeko((FILE *)pFVar2,_Var6 + -4,0);
      fseeko((FILE *)Fp,_Var5 - S,0);
      pFVar2 = Fp;
      NChunks = 0;
      _Var5 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar2,_Var5 + -4,0);
      fread(&NChunks,4,1,(FILE *)pFVar2);
      fseeko((FILE *)pFVar2,_Var5 + -4,0);
      pFVar2 = Fp;
      _Var5 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar2,_Var5 + -4,0);
      fread(&ChunkAddrsSz,4,1,(FILE *)pFVar2);
      fseeko((FILE *)pFVar2,_Var5 + -4,0);
      Mallocator();
      ChunkAddress = 0;
      pcStack_270 = (chunk_cache *)0x0;
      local_268 = &Mallocator::Instance;
      __ScopeGuard__112.Dismissed = false;
      sVar20 = (size_t)ChunkAddrsSz;
      __ScopeGuard__112.Func.CpresChunkAddrs = (buffer *)&ChunkAddress;
      Mallocator();
      AllocBuf((buffer *)&ChunkAddress,sVar20,&Mallocator::Instance.super_allocator);
      pFVar2 = Fp;
      if ((long)pcStack_270 < (long)sVar20) {
LAB_0017333e:
        __assert_fail("Sz <= Size(*Buf)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.h"
                      ,0x9d,"void idx2::ReadBackwardBuffer(FILE *, buffer *, i64)");
      }
      _Var5 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar2,_Var5 - sVar20,0);
      fread((void *)ChunkAddress,sVar20,1,(FILE *)pFVar2);
      fseeko((FILE *)pFVar2,_Var5 - sVar20,0);
      pdVar3 = local_308;
      LOCK();
      (local_308->BytesData_).super___atomic_base<unsigned_long>._M_i =
           (local_308->BytesData_).super___atomic_base<unsigned_long>._M_i + sVar20;
      UNLOCK();
      clock_gettime(1,(timespec *)&FileCache);
      LOCK();
      (pdVar3->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
           (pdVar3->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
           (long)((double)(CONCAT44(FileCache.ChunkOffsets.Buffer.Data._4_4_,
                                    FileCache.ChunkOffsets.Buffer.Data._0_4_) - IOTimer.Start.tv_sec
                          ) * 1000000000.0 +
                 (double)(FileCache.ChunkOffsets.Buffer.Bytes - IOTimer.Start.tv_nsec));
      UNLOCK();
      Mallocator();
      Fp_1 = (FILE *)0x0;
      iStack_1d0 = 0;
      local_1c8 = &Mallocator::Instance;
      __ScopeGuard__116.Dismissed = false;
      lVar10 = (long)NChunks;
      __ScopeGuard__116.Func.ChunkAddrsBuf = (buffer *)&Fp_1;
      Mallocator();
      AllocBuf((buffer *)&Fp_1,lVar10 << 3,&Mallocator::Instance.super_allocator);
      DecompressBufZstd((buffer *)&ChunkAddress,(buffer *)&Fp_1);
      clock_gettime(1,(timespec *)&FileCache);
      clock_gettime(1,(timespec *)&IOTimer);
      pFVar2 = Fp;
      ChunkSizesSz = 0;
      _Var5 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar2,_Var5 + -4,0);
      fread(&ChunkSizesSz,4,1,(FILE *)pFVar2);
      fseeko((FILE *)pFVar2,_Var5 + -4,0);
      Mallocator();
      local_1f8.Data = (byte *)0x0;
      local_1f8.Bytes = 0;
      local_1f8.Alloc = &Mallocator::Instance.super_allocator;
      __ScopeGuard__123.Dismissed = false;
      sVar20 = (size_t)ChunkSizesSz;
      __ScopeGuard__123.Func.ChunkSizesBuf = &local_1f8;
      Mallocator();
      AllocBuf(&local_1f8,sVar20,&Mallocator::Instance.super_allocator);
      bitstream::bitstream((bitstream *)&IOTimer_1);
      pFVar2 = Fp;
      if (local_1f8.Bytes < (long)sVar20) goto LAB_0017333e;
      _Var5 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar2,_Var5 - sVar20,0);
      fread(local_1f8.Data,sVar20,1,(FILE *)pFVar2);
      fseeko((FILE *)pFVar2,_Var5 - sVar20,0);
      pdVar3 = local_308;
      LOCK();
      (local_308->BytesData_).super___atomic_base<unsigned_long>._M_i =
           (local_308->BytesData_).super___atomic_base<unsigned_long>._M_i + sVar20;
      UNLOCK();
      clock_gettime(1,(timespec *)&FileCache);
      LOCK();
      (pdVar3->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
           (pdVar3->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
           (long)((double)(CONCAT44(FileCache.ChunkOffsets.Buffer.Data._4_4_,
                                    FileCache.ChunkOffsets.Buffer.Data._0_4_) - IOTimer.Start.tv_sec
                          ) * 1000000000.0 +
                 (double)(FileCache.ChunkOffsets.Buffer.Bytes - IOTimer.Start.tv_nsec));
      UNLOCK();
      IOTimer_1.Start.tv_sec = (__time_t)local_1f8.Data;
      IOTimer_1.Start.tv_nsec = local_1f8.Bytes;
      local_2e0 = (ulong *)local_1f8.Data;
      local_2d8 = *(ulong *)local_1f8.Data;
      local_2d0 = 0;
      file_cache::file_cache(&FileCache);
      Mallocator();
      Init<unsigned_long,idx2::chunk_cache>
                (&FileCache.ChunkCaches,10,&Mallocator::Instance.super_allocator);
      uVar7 = (ulong)(uint)NChunks;
      lVar10 = 0;
      for (uVar21 = 0; uVar21 != uVar7; uVar21 = uVar21 + 1) {
        bVar8 = 0;
        lVar18 = 0;
        puVar15 = local_2e0;
        uVar16 = local_2d8;
        do {
          puVar14 = puVar15;
          if (0x39 < (int)local_2d0) {
            puVar14 = (ulong *)((long)puVar15 + (ulong)(local_2d0 >> 3));
            uVar16 = *(ulong *)((long)puVar15 + (ulong)(local_2d0 >> 3));
            local_2d0 = local_2d0 & 7;
            local_2e0 = puVar14;
            local_2d8 = uVar16;
          }
          uVar17 = uVar16 >> ((byte)local_2d0 & 0x3f);
          uVar13 = local_2d0 + 7;
          puVar15 = puVar14;
          if (0x38 < (int)local_2d0) {
            puVar15 = (ulong *)((long)puVar14 + (ulong)(uVar13 >> 3));
            uVar16 = *(ulong *)((long)puVar14 + (ulong)(uVar13 >> 3));
            uVar13 = 0;
            local_2e0 = puVar15;
            local_2d8 = uVar16;
          }
          lVar18 = lVar18 + ((uVar17 & bitstream::Masks.Arr[7]) << (bVar8 & 0x3f));
          local_2d0 = uVar13 + 1;
          bVar8 = bVar8 + 7;
        } while ((uVar16 >> ((byte)uVar13 & 0x3f) & bitstream::Masks.Arr[1]) != 0);
        ChunkAddr = *(u64 *)(Fp_1 + uVar21 * 8);
        Val = (chunk_cache *)bitstream::Masks.Arr[7];
        chunk_cache::chunk_cache(&ChunkCache);
        ChunkCache.ChunkPos = (i32)uVar21;
        Insert<unsigned_long,idx2::chunk_cache>
                  ((iterator *)&__ScopeGuard__205,(idx2 *)&FileCache.ChunkCaches,
                   (hash_table<unsigned_long,_idx2::chunk_cache> *)&ChunkAddr,
                   (unsigned_long *)&ChunkCache,Val);
        if (FileCache.ChunkOffsets.Capacity <= FileCache.ChunkOffsets.Size) {
          GrowCapacity<long>(&FileCache.ChunkOffsets,0);
        }
        lVar10 = lVar10 + lVar18;
        *(long *)(CONCAT44(FileCache.ChunkOffsets.Buffer.Data._4_4_,
                           FileCache.ChunkOffsets.Buffer.Data._0_4_) +
                 FileCache.ChunkOffsets.Size * 8) = lVar10;
        FileCache.ChunkOffsets.Size = FileCache.ChunkOffsets.Size + 1;
      }
      if ((FileCacheIt.Ht)->Stats[FileCacheIt.Idx] == Occupied) {
        ((FileCacheIt.Val)->ChunkCaches).Stats = FileCache.ChunkCaches.Stats;
        ((FileCacheIt.Val)->ChunkCaches).Size = FileCache.ChunkCaches.Size;
        ((FileCacheIt.Val)->ChunkCaches).LogCapacity = FileCache.ChunkCaches.LogCapacity;
        ((FileCacheIt.Val)->ChunkCaches).Alloc = FileCache.ChunkCaches.Alloc;
        ((FileCacheIt.Val)->ChunkCaches).Keys = FileCache.ChunkCaches.Keys;
        ((FileCacheIt.Val)->ChunkCaches).Vals = FileCache.ChunkCaches.Vals;
        ((FileCacheIt.Val)->ChunkCaches).Stats = FileCache.ChunkCaches.Stats;
        ((FileCacheIt.Val)->ChunkCaches).Size = FileCache.ChunkCaches.Size;
        ((FileCacheIt.Val)->ChunkOffsets).Buffer.Data =
             (byte *)CONCAT44(FileCache.ChunkOffsets.Buffer.Data._4_4_,
                              FileCache.ChunkOffsets.Buffer.Data._0_4_);
        ((FileCacheIt.Val)->ChunkOffsets).Buffer.Bytes = FileCache.ChunkOffsets.Buffer.Bytes;
        ((FileCacheIt.Val)->ChunkOffsets).Buffer.Alloc = FileCache.ChunkOffsets.Buffer.Alloc;
        ((FileCacheIt.Val)->ChunkOffsets).Size = FileCache.ChunkOffsets.Size;
        ((FileCacheIt.Val)->ChunkOffsets).Buffer.Alloc = FileCache.ChunkOffsets.Buffer.Alloc;
        ((FileCacheIt.Val)->ChunkOffsets).Size = FileCache.ChunkOffsets.Size;
        ((FileCacheIt.Val)->ChunkOffsets).Capacity = FileCache.ChunkOffsets.Capacity;
        ((FileCacheIt.Val)->ChunkOffsets).Alloc =
             (allocator *)
             CONCAT44(FileCache.ChunkOffsets.Alloc._4_4_,FileCache.ChunkOffsets.Alloc._0_4_);
      }
      else {
        Insert<unsigned_long,idx2::file_cache>(&FileCacheIt,&FileId.Id,&FileCache);
      }
      (FileCacheIt.Val)->DataCached = true;
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x9e;
      scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp:123:3)>
      ::~scope_guard(&__ScopeGuard__123);
      scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp:116:3)>
      ::~scope_guard(&__ScopeGuard__116);
      scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp:112:3)>
      ::~scope_guard(&__ScopeGuard__112);
      pcVar19 = "";
      uVar11 = 0;
    }
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp:98:3)>
    ::~scope_guard(&__ScopeGuard__98);
  }
  if ((char)uVar11 == '\0') {
    if ((FileCacheIt.Ht)->Stats[FileCacheIt.Idx] == Occupied) {
      cVar12 = (char)local_310;
      if ('\x0f' < cVar12) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
      }
      uVar7 = (ulong)(Idx2->BricksPerChunk).Arr[cVar12];
      lVar10 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      bVar8 = -(uVar7 == 0) | (byte)lVar10;
      ChunkAddress = ((ulong)((ushort)BpKey & 0xfff) |
                     (long)((int)(char)local_2fc << 0xc) + ((ulong)((uint)local_310 & 0xff) << 0x3c)
                     ) + (local_258 >> ((1L << (bVar8 & 0x3f) != uVar7) + bVar8 & 0x3f)) * 0x40000;
      Lookup<unsigned_long,idx2::chunk_cache>
                ((iterator *)&FileCache,(idx2 *)&(FileCacheIt.Val)->ChunkCaches,
                 (hash_table<unsigned_long,_idx2::chunk_cache> *)&ChunkAddress,
                 (unsigned_long *)ChunkAddress);
      ChunkCache_00 = FileCache.ChunkOffsets.Buffer.Bytes;
      if (*(char *)((long)FileCache.ChunkOffsets.Buffer.Alloc[2]._vptr_allocator +
                   FileCache.ChunkOffsets.Size) == '\x02') {
        if (*(long *)(FileCache.ChunkOffsets.Buffer.Bytes + 0x70) == 0) {
          clock_gettime(1,(timespec *)&IOTimer_1);
          local_310 = fopen(FileId.Name.field_0.Ptr,"rb");
          __ScopeGuard__205.Func.Fp = &Fp_1;
          __ScopeGuard__205.Dismissed = false;
          Fp_1 = (FILE *)local_310;
          if (local_310 == (FILE *)0x0) {
            *(char **)(*in_FS_OFFSET + -0xb80) =
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
            ;
            *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0xcf;
            sVar22 = ToString(FileNotFound);
            lVar10 = *in_FS_OFFSET;
            iVar4 = snprintf((char *)(lVar10 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                             (ulong)(uint)sVar22.Size,sVar22.field_0.Ptr,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                             ,0xcf);
            snprintf((char *)(lVar10 + -0xf80) + iVar4,0x400 - (long)iVar4,"File: %s\n",
                     FileId.Name.field_0.Ptr);
            local_320->_vptr_expected = (_func_int **)&PTR__expected_001aeb88;
            (local_320->field_1).Val = (chunk_cache *)"File: %s\n";
            (local_320->field_1).Err.StrGened = true;
            *(undefined2 *)((long)&local_320->field_1 + 8) = 0x25;
            *(undefined4 *)((long)&local_320->field_1 + 0xb) =
                 FileCache.ChunkOffsets.Buffer.Data._0_4_;
            *(undefined1 *)((long)&local_320->field_1 + 0xf) =
                 FileCache.ChunkOffsets.Buffer.Data._4_1_;
            local_320->Ok = false;
          }
          else {
            lVar10 = (long)*(int *)ChunkCache_00;
            pbVar1 = ((FileCacheIt.Val)->ChunkOffsets).Buffer.Data;
            if (lVar10 < 1) {
              lVar18 = 0;
            }
            else {
              lVar18 = *(long *)(pbVar1 + lVar10 * 8 + -8);
            }
            lVar10 = *(long *)(pbVar1 + lVar10 * 8);
            fseeko(local_310,lVar18,0);
            bitstream::bitstream((bitstream *)&FileCache);
            Mallocator();
            (**(code **)Mallocator::Instance.super_allocator._vptr_allocator)
                      (&Mallocator::Instance,&FileCache,(lVar10 - lVar18) + 8);
            FileCache.ChunkOffsets.Size =
                 CONCAT44(FileCache.ChunkOffsets.Buffer.Data._4_4_,
                          FileCache.ChunkOffsets.Buffer.Data._0_4_);
            FileCache.ChunkOffsets.Alloc._0_4_ = 0;
            FileCache.ChunkOffsets.Capacity = 0;
            fread((void *)FileCache.ChunkOffsets.Size,FileCache.ChunkOffsets.Buffer.Bytes,1,
                  (FILE *)Fp_1);
            pdVar3 = local_308;
            LOCK();
            (local_308->BytesData_).super___atomic_base<unsigned_long>._M_i =
                 (local_308->BytesData_).super___atomic_base<unsigned_long>._M_i +
                 FileCache.ChunkOffsets.Buffer.Bytes;
            UNLOCK();
            clock_gettime(1,(timespec *)&ChunkCache);
            LOCK();
            (pdVar3->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
                 (pdVar3->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
                 (long)((double)(CONCAT44(ChunkCache._4_4_,ChunkCache.ChunkPos) -
                                IOTimer_1.Start.tv_sec) * 1000000000.0 +
                       (double)((long)ChunkCache.Bricks.Buffer.Data - IOTimer_1.Start.tv_nsec));
            UNLOCK();
            uVar7 = (ulong)(Idx2->BricksPerChunk).Arr[cVar12];
            lVar10 = 0x3f;
            if (uVar7 != 0) {
              for (; uVar7 >> lVar10 == 0; lVar10 = lVar10 + -1) {
              }
            }
            bVar8 = -(uVar7 == 0) | (byte)lVar10;
            DecompressChunk((bitstream *)&FileCache,(chunk_cache *)ChunkCache_00,ChunkAddress,
                            (int)(char)((1L << (bVar8 & 0x3f) != uVar7) + bVar8));
          }
          scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp:205:5)>
          ::~scope_guard(&__ScopeGuard__205);
          if (local_310 == (FILE *)0x0) {
            return local_320;
          }
        }
        local_320->_vptr_expected = (_func_int **)&PTR__expected_001aeb88;
        (local_320->field_1).Val = (chunk_cache *)ChunkCache_00;
        bVar9 = true;
      }
      else {
        *(char **)(*in_FS_OFFSET + -0xb80) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x980) = 199;
        local_320->_vptr_expected = (_func_int **)&PTR__expected_001aeb88;
        (local_320->field_1).Val = (chunk_cache *)0x19942d;
        (local_320->field_1).Err.StrGened = false;
        *(undefined2 *)((long)&local_320->field_1 + 8) = 0x23;
        bVar9 = false;
      }
      local_320->Ok = bVar9;
      return local_320;
    }
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0xbe;
    sVar22 = ToString(FileNotFound);
    lVar10 = *in_FS_OFFSET;
    iVar4 = snprintf((char *)(lVar10 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                     (ulong)(uint)sVar22.Size,sVar22.field_0.Ptr,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                     ,0xbe);
    snprintf((char *)(lVar10 + -0xf80) + iVar4,0x400 - (long)iVar4,"File: %s\n",
             FileId.Name.field_0.Ptr);
    local_320->_vptr_expected = (_func_int **)&PTR__expected_001aeb88;
    (local_320->field_1).Val = (chunk_cache *)"File: %s\n";
    (local_320->field_1).Err.StrGened = true;
    *(undefined2 *)((long)&local_320->field_1 + 8) = 0x25;
    *(undefined4 *)((long)&local_320->field_1 + 0xb) = FileCache.ChunkOffsets.Buffer.Data._0_4_;
    *(undefined1 *)((long)&local_320->field_1 + 0xf) = FileCache.ChunkOffsets.Buffer.Data._4_1_;
  }
  else {
    *(undefined4 *)(*in_FS_OFFSET + -0x97c) = 0xbc;
    *(char **)(*in_FS_OFFSET + -0xb78) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
    ;
    local_320->_vptr_expected = (_func_int **)&PTR__expected_001aeb88;
    (local_320->field_1).Val = (chunk_cache *)pcVar19;
    (local_320->field_1).Err.StrGened = SUB41((uint)uVar11 >> 0x10,0);
    *(ushort *)((long)&local_320->field_1 + 8) = (ushort)uVar11 | 0x100;
  }
  local_320->Ok = false;
  return local_320;
}

Assistant:

expected<const chunk_cache*, idx2_err_code>
ReadChunk(const idx2_file& Idx2, decode_data* D, u64 Brick, i8 Level, i8 Subband, i16 BpKey)
{
#if VISUS_IDX2
  if (Idx2.external_read)
  {
    u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, BpKey);
    auto ChunkCacheIt = Lookup(D->FileCache.ChunkCaches, ChunkAddress);
    if (ChunkCacheIt)
      return ChunkCacheIt.Val;

    bitstream ChunkStream;
    bool Result = Idx2.external_read(Idx2, ChunkStream.Stream, ChunkAddress).get();
    idx2_ReturnErrorIf(!Result, idx2_err_code::ChunkNotFound);

    //decompress part
    chunk_cache ChunkCache;
    DecompressChunk(&ChunkStream, &ChunkCache, ChunkAddress, Log2Ceil(Idx2.BricksPerChunk[Level]));
    Insert(&ChunkCacheIt, ChunkAddress, ChunkCache);
    return ChunkCacheIt.Val;
  }
#endif

  file_id FileId = ConstructFilePath(Idx2, Brick, Level, Subband, BpKey);
  auto FileCacheIt = Lookup(D->FileCacheTable, FileId.Id);
  idx2_PropagateIfError(ReadFile(Idx2, D, &FileCacheIt, FileId));
  if (!FileCacheIt)
    return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);

  /* find the appropriate chunk */
  u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, BpKey);
  //printf("chunk %llu\n", ChunkAddress);
  const file_cache* FileCache = FileCacheIt.Val;
  decltype(FileCache->ChunkCaches)::iterator ChunkCacheIt;
  ChunkCacheIt = Lookup(FileCache->ChunkCaches, ChunkAddress);
  if (!ChunkCacheIt)
    return idx2_Error(idx2_err_code::ChunkNotFound);
  chunk_cache* ChunkCache = ChunkCacheIt.Val;
  if (Size(ChunkCache->ChunkStream.Stream) == 0) // chunk has not been loaded
  {
    timer IOTimer;
    StartTimer(&IOTimer);
    idx2_RAII(FILE*, Fp = fopen(FileId.Name.ConstPtr, "rb"), , if (Fp) fclose(Fp));
    if (!Fp)
      return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);
    i32 ChunkPos = ChunkCache->ChunkPos;
    i64 ChunkOffset = ChunkPos > 0 ? FileCache->ChunkOffsets[ChunkPos - 1] : 0;
    i64 ChunkSize = FileCache->ChunkOffsets[ChunkPos] - ChunkOffset;
    idx2_FSeek(Fp, ChunkOffset, SEEK_SET);
    bitstream ChunkStream;
    // NOTE: not a memory leak since we will keep track of this in ChunkCache
    InitWrite(&ChunkStream, ChunkSize);
    ReadBuffer(Fp, &ChunkStream.Stream);
    D->BytesData_ += Size(ChunkStream.Stream);
    D->DecodeIOTime_ += ElapsedTime(&IOTimer);
    // TODO: check for error
    DecompressChunk(&ChunkStream, ChunkCache, ChunkAddress, Log2Ceil(Idx2.BricksPerChunk[Level]));
  }

  return ChunkCacheIt.Val;
}